

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanLt(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  uint local_5c;
  uint local_4c;
  uint local_44;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 2) {
    return -1;
  }
  if (ptr[1] == '\0') {
    local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  }
  else {
    local_34 = unicode_byte_type(ptr[1],*ptr);
  }
  switch(local_34) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    *nextTokPtr = ptr;
    return 0;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0xf:
    iVar1 = little2_scanPi(enc,ptr + 2,end,nextTokPtr);
    return iVar1;
  case 0x10:
    pbVar2 = (byte *)(ptr + 2);
    if ((long)end - (long)pbVar2 < 2) {
      return -1;
    }
    if (ptr[3] == '\0') {
      local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar2);
    }
    else {
      local_44 = unicode_byte_type(ptr[3],*pbVar2);
    }
    if (local_44 != 0x14) {
      if (local_44 == 0x1b) {
        iVar1 = little2_scanComment(enc,ptr + 4,end,nextTokPtr);
        return iVar1;
      }
      *nextTokPtr = (char *)pbVar2;
      return 0;
    }
    iVar1 = little2_scanCdataSection(enc,ptr + 4,end,nextTokPtr);
    return iVar1;
  case 0x11:
    iVar1 = little2_scanEndTag(enc,ptr + 2,end,nextTokPtr);
    return iVar1;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)ptr[1]] * 8 + ((int)(uint)(byte)*ptr >> 5))]
        & 1 << (*ptr & 0x1fU)) == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
  case 0x16:
  case 0x18:
    end_local = ptr + 2;
  }
  do {
    if ((long)end - (long)end_local < 2) {
      return -1;
    }
    if (end_local[1] == '\0') {
      local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    }
    else {
      local_4c = unicode_byte_type(end_local[1],*end_local);
    }
    switch(local_4c) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      *nextTokPtr = end_local;
      return 0;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      pcVar3 = end_local;
      goto LAB_006191d8;
    case 0xb:
      goto LAB_006193bc;
    case 0x11:
      goto LAB_006193d9;
    case 0x1d:
      if ((namingBitmap
           [(int)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[(byte)end_local[1]] * 8 +
                 ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 2;
    }
  } while( true );
LAB_006191d8:
  end_local = pcVar3 + 2;
  if ((long)end - (long)end_local < 2) {
    return -1;
  }
  if (pcVar3[3] == '\0') {
    local_5c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
  }
  else {
    local_5c = unicode_byte_type(pcVar3[3],*end_local);
  }
  switch(local_5c) {
  case 5:
    if ((long)end - (long)end_local < 2) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  case 6:
    if ((long)end - (long)end_local < 3) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  case 7:
    if ((long)end - (long)end_local < 4) {
      return -2;
    }
    *nextTokPtr = end_local;
    return 0;
  default:
    *nextTokPtr = end_local;
    return 0;
  case 9:
  case 10:
  case 0x15:
    pcVar3 = end_local;
    break;
  case 0xb:
LAB_006193bc:
    *nextTokPtr = end_local + 2;
    return 2;
  case 0x11:
LAB_006193d9:
    pcVar3 = end_local + 2;
    if ((long)end - (long)pcVar3 < 2) {
      return -1;
    }
    if ((end_local[3] == '\0') && (*pcVar3 == '>')) {
      *nextTokPtr = end_local + 4;
      return 4;
    }
    *nextTokPtr = pcVar3;
    return 0;
  case 0x1d:
    if ((namingBitmap
         [(int)((uint)"\x02\x03\x04\x05\x06\a\b"[(byte)pcVar3[3]] * 8 +
               ((int)(uint)(byte)*end_local >> 5))] & 1 << (*end_local & 0x1fU)) == 0) {
      *nextTokPtr = end_local;
      return 0;
    }
  case 0x16:
  case 0x18:
    iVar1 = little2_scanAtts(enc,pcVar3 + 4,end,nextTokPtr);
    return iVar1;
  }
  goto LAB_006191d8;
}

Assistant:

static int PTRCALL
PREFIX(scanLt)(const ENCODING *enc, const char *ptr, const char *end,
               const char **nextTokPtr)
{
#ifdef XML_NS
  int hadColon;
#endif
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_EXCL:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_MINUS:
      return PREFIX(scanComment)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_LSQB:
      return PREFIX(scanCdataSection)(enc, ptr + MINBPC(enc),
                                      end, nextTokPtr);
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_QUEST:
    return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_SOL:
    return PREFIX(scanEndTag)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
#ifdef XML_NS
  hadColon = 0;
#endif
  /* we have a start-tag */
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
#ifdef XML_NS
    case BT_COLON:
      if (hadColon) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      hadColon = 1;
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
      default:
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      break;
#endif
    case BT_S: case BT_CR: case BT_LF:
      {
        ptr += MINBPC(enc);
        while (HAS_CHAR(enc, ptr, end)) {
          switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
          case BT_GT:
            goto gt;
          case BT_SOL:
            goto sol;
          case BT_S: case BT_CR: case BT_LF:
            ptr += MINBPC(enc);
            continue;
          default:
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          return PREFIX(scanAtts)(enc, ptr, end, nextTokPtr);
        }
        return XML_TOK_PARTIAL;
      }
    case BT_GT:
    gt:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_START_TAG_NO_ATTS;
    case BT_SOL:
    sol:
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_EMPTY_ELEMENT_NO_ATTS;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}